

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::HttpSocket::_OnUpdate(HttpSocket *this)

{
  size_type sVar1;
  
  if ((((this->_inProgress == true) && (this->_chunkedTransfer == false)) && (this->_remaining == 0)
      ) && (this->_status != 0)) {
    _FinishRequest(this);
  }
  sVar1 = std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::size
                    (&(this->_requestQ).c);
  if (((sVar1 != 0) && (this->_remaining == 0)) &&
     ((this->_chunkedTransfer == false && (this->_inProgress == false)))) {
    _DequeueMore(this);
  }
  return true;
}

Assistant:

bool HttpSocket::_OnUpdate()
{
    if(!TcpSocket::_OnUpdate())
        return false;

    if(_inProgress && !_chunkedTransfer && !_remaining && _status)
        _FinishRequest();

    //traceprint("HttpSocket::_OnUpdate, Q = %d\n", (unsigned)_requestQ.size());

    // initiate transfer if queue is not empty, but the socket somehow forgot to proceed
    if(_requestQ.size() && !_remaining && !_chunkedTransfer && !_inProgress)
        _DequeueMore();

    return true;
}